

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O2

bool __thiscall cmValue::IsNOTFOUND(cmValue *this,string_view value)

{
  bool bVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view suffix;
  
  __x._M_str = (char *)value._M_len;
  __x._M_len = (size_t)this;
  __y._M_str = "NOTFOUND";
  __y._M_len = 8;
  bVar1 = std::operator==(__x,__y);
  bVar2 = true;
  if (!bVar1) {
    str._M_str = __x._M_str;
    str._M_len = (size_t)this;
    suffix._M_str = "-NOTFOUND";
    suffix._M_len = 9;
    bVar2 = cmHasSuffix(str,suffix);
  }
  return bVar2;
}

Assistant:

bool cmValue::IsNOTFOUND(cm::string_view value) noexcept
{
  return (value == "NOTFOUND"_s) || cmHasSuffix(value, "-NOTFOUND"_s);
}